

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlm_gp.cpp
# Opt level: O1

uint tlm::tlm_extension_base::register_extension(type_info *type)

{
  _Rb_tree<sc_core::sc_type_index,_std::pair<const_sc_core::sc_type_index,_unsigned_int>,_std::_Select1st<std::pair<const_sc_core::sc_type_index,_unsigned_int>_>,_std::less<sc_core::sc_type_index>,_std::allocator<std::pair<const_sc_core::sc_type_index,_unsigned_int>_>_>
  *this;
  iterator iVar1;
  key_type local_28;
  value_type local_20;
  
  this = (_Rb_tree<sc_core::sc_type_index,_std::pair<const_sc_core::sc_type_index,_unsigned_int>,_std::_Select1st<std::pair<const_sc_core::sc_type_index,_unsigned_int>_>,_std::less<sc_core::sc_type_index>,_std::allocator<std::pair<const_sc_core::sc_type_index,_unsigned_int>_>_>
          *)anon_unknown_2::tlm_extension_registry::instance();
  local_28.info_ = type;
  iVar1 = std::
          _Rb_tree<sc_core::sc_type_index,_std::pair<const_sc_core::sc_type_index,_unsigned_int>,_std::_Select1st<std::pair<const_sc_core::sc_type_index,_unsigned_int>_>,_std::less<sc_core::sc_type_index>,_std::allocator<std::pair<const_sc_core::sc_type_index,_unsigned_int>_>_>
          ::find(this,&local_28);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->_M_impl).super__Rb_tree_header) {
    local_20.second = (uint)(this->_M_impl).super__Rb_tree_header._M_node_count;
    local_20.first.info_ = local_28.info_;
    std::
    _Rb_tree<sc_core::sc_type_index,_std::pair<const_sc_core::sc_type_index,_unsigned_int>,_std::_Select1st<std::pair<const_sc_core::sc_type_index,_unsigned_int>_>,_std::less<sc_core::sc_type_index>,_std::allocator<std::pair<const_sc_core::sc_type_index,_unsigned_int>_>_>
    ::_M_insert_unique(this,&local_20);
  }
  else {
    local_20.second = *(uint *)&iVar1._M_node[1]._M_parent;
  }
  return local_20.second;
}

Assistant:

unsigned int
tlm_extension_base::register_extension(const std::type_info& type)
{
    return tlm_extension_registry::instance().register_extension(type);
}